

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdBitmapColor0::emulate_mthd(MthdBitmapColor0 *this)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  pgraph_color color;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type;
  if ((int)uVar2 < 4) {
    color = pgraph_expand_color(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                                (this->super_SingleMthdTest).super_MthdTest.val);
    uVar4 = pgraph_to_a1r10g10b10(color);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bitmap_color[0] = uVar4;
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x4b) {
    nv04_pgraph_set_bitmap_color_0_nv01
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
               (this->super_SingleMthdTest).super_MthdTest.val);
  }
  else {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bitmap_color[0] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    iVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
            chipset.chipset;
    if (iVar3 != 5 && (0x1f < uVar2 || (iVar3 == 0x1a || iVar3 < 0x17))) {
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
      uVar4 = pgraph_grobj_get_color_format
                        (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
           uVar4 & 0xff | uVar2 & 0xffffff00;
    }
  }
  if (2 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     2);
    *pbVar1 = *pbVar1 | 2;
  }
  return;
}

Assistant:

void MthdBitmapColor0::emulate_mthd() {
	if (chipset.card_type < 4) {
		exp.bitmap_color[0] = pgraph_to_a1r10g10b10(pgraph_expand_color(&exp, val));
	} else {
		if (cls == 0x4b) {
			nv04_pgraph_set_bitmap_color_0_nv01(&exp, val);
		} else {
			exp.bitmap_color[0] = val;
			bool likes_format = false;
			if (nv04_pgraph_is_nv17p(&chipset) || chipset.chipset == 5)
				likes_format = true;
			if (!likes_format)
				insrt(exp.ctx_format, 0, 8, pgraph_grobj_get_color_format(&exp));
		}
	}
	if (chipset.card_type >= 3)
		insrt(exp.valid[0], 17, 1, 1);
}